

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O1

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  SFInstrumentZone *pSVar1;
  SFInstrumentZone *pSVar2;
  
  std::__cxx11::string::operator=((string *)this,(string *)origin);
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::_M_move_assign(&this->zones_,&origin->zones_);
  pSVar1 = (origin->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  (origin->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>.
  _M_t.
  super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = (SFInstrumentZone *)0x0;
  pSVar2 = (this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>.
  _M_t.
  super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = pSVar1;
  if (pSVar2 != (SFInstrumentZone *)0x0) {
    (**(code **)((long)(pSVar2->super_SFZone)._vptr_SFZone + 8))();
  }
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFInstrument & SFInstrument::operator=(SFInstrument && origin) noexcept {
  // Copy fields.
  name_ = std::move(origin.name_);
  zones_ = std::move(origin.zones_);
  global_zone_ = std::move(origin.global_zone_);
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}